

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbstrmatrix.cpp
# Opt level: O0

TPZStructMatrix * __thiscall
TPZBandStructMatrix<double,_TPZStructMatrixOR<double>_>::Clone
          (TPZBandStructMatrix<double,_TPZStructMatrixOR<double>_> *this)

{
  TPZStructMatrix *pTVar1;
  TPZBandStructMatrix<double,_TPZStructMatrixOR<double>_> *in_RDI;
  TPZBandStructMatrix<double,_TPZStructMatrixOR<double>_> *unaff_retaddr;
  
  pTVar1 = (TPZStructMatrix *)operator_new(0xb8);
  TPZBandStructMatrix(unaff_retaddr,in_RDI);
  return pTVar1;
}

Assistant:

TPZStructMatrix * TPZBandStructMatrix<TVar,TPar>::Clone(){
    return new TPZBandStructMatrix(*this);
}